

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O0

int sys_loadlib_iter(char *path,_loadlib_data *data)

{
  loader_queue_t *local_28;
  loader_queue_t *q;
  int ok;
  _loadlib_data *data_local;
  char *path_local;
  
  q._4_4_ = 0;
  local_28 = &loaders;
  while ((local_28 != (loader_queue_t *)0x0 &&
         (q._4_4_ = (*local_28->loader)(data->canvas,data->classname,path), q._4_4_ == 0))) {
    local_28 = local_28->next;
  }
  if (q._4_4_ == 0) {
    q._4_4_ = sys_do_load_abs(data->canvas,data->classname,path);
  }
  data->ok = q._4_4_;
  return (int)(q._4_4_ == 0);
}

Assistant:

int sys_loadlib_iter(const char *path, struct _loadlib_data *data)
{
    int ok = 0;
    loader_queue_t *q;
    for(q = &loaders; q; q = q->next)
        if ((ok = q->loader(data->canvas, data->classname, path)))
            break;
    /* if all loaders failed, try to load as abstraction */
    if (!ok)
        ok = sys_do_load_abs(data->canvas, data->classname, path);
    data->ok = ok;
    return (ok == 0);
}